

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::SourceLocationTable::AddImport
          (SourceLocationTable *this,Message *descriptor,string *name,int line,int column)

{
  mapped_type *this_00;
  pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  pair<int,_int> local_30;
  int local_28;
  int local_24;
  int column_local;
  int line_local;
  string *name_local;
  Message *descriptor_local;
  SourceLocationTable *this_local;
  
  local_28 = column;
  local_24 = line;
  _column_local = name;
  name_local = (string *)descriptor;
  descriptor_local = (Message *)this;
  local_30 = std::make_pair<int&,int&>(&local_24,&local_28);
  std::make_pair<google::protobuf::Message_const*&,std::__cxx11::string_const&>
            (&local_58,(Message **)&name_local,_column_local);
  this_00 = std::
            map<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>,_std::less<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
            ::operator[](&this->import_location_map_,&local_58);
  std::pair<int,_int>::operator=(this_00,&local_30);
  std::
  pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_58);
  return;
}

Assistant:

void SourceLocationTable::AddImport(const Message* descriptor,
                                    const std::string& name, int line,
                                    int column) {
  import_location_map_[std::make_pair(descriptor, name)] =
      std::make_pair(line, column);
}